

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDInt32x4Operation::OpFromFloat64x2(SIMDValue *value)

{
  SIMDValue SVar1;
  
  SVar1.field_0.i32[1] = (int)(value->field_0).f64[1];
  SVar1.field_0.i32[0] = (int)(value->field_0).f64[0];
  SVar1.field_0.f64[1] = 0.0;
  return (SIMDValue)SVar1.field_0;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpFromFloat64x2(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the 2 double-precision, floating-point values to 32-bit signed integers
        // using truncate. using truncate one instead of _mm_cvtpd_epi32
        x86Result.m128i_value = _mm_cvttpd_epi32(v.m128d_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }